

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::UnitTest::UponLeavingGTest(UnitTest *this)

{
  UnitTestImpl *pUVar1;
  OsStackTraceGetterInterface *pOVar2;
  
  pUVar1 = this->impl_;
  if (pUVar1->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
    pOVar2 = (OsStackTraceGetterInterface *)operator_new(8);
    pOVar2->_vptr_OsStackTraceGetterInterface =
         (_func_int **)&PTR__OsStackTraceGetterInterface_0070fc00;
    pUVar1->os_stack_trace_getter_ = pOVar2;
  }
  (*pUVar1->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[3])();
  return;
}

Assistant:

void SplitString(const ::std::string& str, char delimiter,
                 ::std::vector< ::std::string>* dest) {
  ::std::vector< ::std::string> parsed;
  ::std::string::size_type pos = 0;
  while (::testing::internal::AlwaysTrue()) {
    const ::std::string::size_type colon = str.find(delimiter, pos);
    if (colon == ::std::string::npos) {
      parsed.push_back(str.substr(pos));
      break;
    } else {
      parsed.push_back(str.substr(pos, colon - pos));
      pos = colon + 1;
    }
  }
  dest->swap(parsed);
}